

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ModuleEnumerator.cpp
# Opt level: O2

ModuleIterator * __thiscall
axl::spy::ModuleIterator::operator++
          (ModuleIterator *__return_storage_ptr__,ModuleIterator *this,int param_1)

{
  ModuleIterator(__return_storage_ptr__,this);
  operator++(this);
  return __return_storage_ptr__;
}

Assistant:

ModuleIterator
ModuleIterator::operator ++ (int) {
	ModuleIterator it = *this;
	operator ++ ();
	return it;
}